

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_avx2.c
# Opt level: O2

void av1_highbd_apply_temporal_filter_avx2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint8_t *puVar4;
  undefined1 auVar5 [32];
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  byte bVar16;
  byte bVar17;
  uint16_t *puVar18;
  uint uVar19;
  uint uVar20;
  byte bVar22;
  byte bVar23;
  undefined7 in_register_00000011;
  undefined1 (*pauVar24) [32];
  long lVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 *puVar29;
  uint uVar30;
  int *piVar31;
  long lVar32;
  undefined1 (*pauVar33) [32];
  ulong uVar34;
  ulong uVar35;
  int row;
  int iVar36;
  ulong uVar37;
  uint uVar38;
  int subblock_idx;
  long lVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [32];
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  double dVar49;
  double dVar60;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  __m256i vsrc [5];
  double d_factor [4];
  double subblock_mses_scaled [4];
  uint32_t frame_sse [1152];
  uint32_t acc_5x5_sse [32] [32];
  uint32_t luma_sse_sum [1024];
  int local_3454;
  double local_3410;
  int *local_33f0;
  undefined1 *local_33e8;
  undefined1 local_33e0 [32];
  undefined1 local_33c0 [32];
  undefined8 local_33a0 [4];
  undefined1 local_3380 [32];
  undefined1 local_3360 [32];
  undefined1 local_3330 [16];
  long local_3320;
  macroblockd_plane *local_3318;
  YV12_BUFFER_CONFIG *local_3310;
  ulong local_3308;
  ulong local_3300;
  uint16_t *local_32f8;
  ulong local_32f0;
  long local_32e8;
  ulong local_32e0;
  uint32_t *local_32d8;
  undefined1 local_32d0 [16];
  double local_32c0 [8];
  double adStack_3280 [4];
  int local_3260 [2];
  undefined1 auStack_3258 [32];
  undefined1 auStack_3238 [32];
  undefined1 auStack_3218 [32];
  undefined1 auStack_31f8 [4504];
  undefined1 local_2060 [4096];
  int local_1060 [1036];
  ulong uVar21;
  
  uVar28 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  iVar36 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar26 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar26 < iVar36) {
    iVar36 = iVar26;
  }
  bVar1 = block_size_high[uVar28];
  dVar48 = (double)q_factor / 20.0;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar48 * dVar48;
  auVar52 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar66);
  auVar43 = vcmpsd_avx(auVar66,ZEXT816(0x3ee4f8b588e368f1),1);
  auVar61._8_8_ = 0x3ee4f8b588e368f1;
  auVar61._0_8_ = 0x3ee4f8b588e368f1;
  local_3330 = vblendvpd_avx(auVar52,auVar61,auVar43);
  dVar48 = (double)q_factor * 0.015625;
  bVar2 = block_size_wide[uVar28];
  local_3410 = dVar48 * dVar48 * 0.5;
  dVar48 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar48;
  auVar52 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar43);
  local_32c0[0] = 0.0;
  local_32c0[1] = 0.0;
  local_32c0[2] = 0.0;
  local_32c0[3] = 0.0;
  lVar39 = 0;
  local_3310 = frame_to_filter;
  memset(local_3260,0,0x1200);
  memset(local_1060,0,0x1000);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (double)iVar36 * 0.1;
  auVar43 = vmaxsd_avx(auVar44,ZEXT816(0x3ff0000000000000));
  for (; lVar39 != 4; lVar39 = lVar39 + 1) {
    auVar44 = vpmovsxwd_avx(ZEXT416((uint)subblock_mvs[lVar39]));
    auVar44 = vcvtdq2pd_avx(auVar44);
    dVar49 = auVar44._0_8_ * auVar44._0_8_;
    dVar60 = auVar44._8_8_ * auVar44._8_8_;
    auVar50._0_8_ = dVar49 + dVar60;
    auVar50._8_8_ = dVar49 + dVar60;
    auVar44 = vsqrtsd_avx(auVar50,auVar50);
    auVar51._0_8_ = auVar44._0_8_ / auVar43._0_8_;
    auVar51._8_8_ = auVar44._8_8_;
    auVar44 = vmaxsd_avx(auVar51,ZEXT816(0x3ff0000000000000));
    local_32c0[lVar39] = auVar44._0_8_;
  }
  if (q_factor < 0x80) {
    local_3410 = (double)local_3330._0_8_;
  }
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar48;
  auVar43 = vcmpsd_avx(auVar45,ZEXT816(0x3ee4f8b588e368f1),1);
  local_32d0 = vblendvpd_avx(auVar52,auVar61,auVar43);
  local_3318 = mbd->plane;
  if (num_planes < 1) {
    num_planes = 0;
  }
  local_3308 = (ulong)(uint)num_planes;
  local_3320 = (long)pred * 2 + 0x20;
  local_3454 = 0;
  uVar28 = 0;
  while (uVar28 != local_3308) {
    bVar22 = (byte)local_3318[uVar28].subsampling_y;
    bVar16 = bVar1 >> (bVar22 & 0x1f);
    uVar19 = (uint)bVar16;
    uVar27 = CONCAT44(0,uVar19);
    bVar23 = (byte)local_3318[uVar28].subsampling_x;
    bVar17 = bVar2 >> (bVar23 & 0x1f);
    uVar20 = (uint)bVar17;
    uVar21 = (ulong)uVar20;
    bVar23 = bVar23 - (char)mbd->plane[0].subsampling_x;
    bVar22 = bVar22 - (char)mbd->plane[0].subsampling_y;
    dVar48 = 0.04;
    if (uVar28 != 0) {
      dVar48 = 1.0 / (double)((1 << (bVar22 + bVar23 & 0x1f)) + 0x19);
    }
    uVar30 = *(uint *)((long)local_3310->store_buf_adr + (ulong)(uVar28 != 0) * 4 + -0x28);
    puVar4 = local_3310->store_buf_adr[uVar28 - 4];
    dVar49 = log(noise_levels[uVar28] + noise_levels[uVar28] + 5.0);
    local_3300 = uVar28;
    local_3330._0_8_ = uVar27;
    if (uVar28 == 1) {
      uVar6 = 1 << (bVar23 & 0x1f);
      if (1 << (bVar23 & 0x1f) < 1) {
        uVar6 = 0;
      }
      uVar7 = 1 << (bVar22 & 0x1f);
      if (1 << (bVar22 & 0x1f) < 1) {
        uVar7 = 0;
      }
      for (uVar28 = 0; uVar28 != uVar27; uVar28 = uVar28 + 1) {
        for (uVar34 = 0; uVar34 != uVar21; uVar34 = uVar34 + 1) {
          iVar36 = ((int)uVar34 << (bVar23 & 0x1f)) + (((int)uVar28 << (bVar22 & 0x1f)) * 0x24 | 2U)
          ;
          for (uVar38 = 0; uVar40 = (ulong)uVar6, iVar26 = iVar36, uVar38 != uVar7;
              uVar38 = uVar38 + 1) {
            while (bVar42 = uVar40 != 0, uVar40 = uVar40 - 1, bVar42) {
              local_1060[uVar34 + uVar28 * 0x20] =
                   local_1060[uVar34 + uVar28 * 0x20] + local_3260[iVar26];
              iVar26 = iVar26 + 1;
            }
            iVar36 = iVar36 + 0x24;
          }
        }
      }
    }
    lVar32 = (long)(int)(uVar20 * mb_col + uVar30 * uVar19 * mb_row);
    lVar39 = (long)local_3454;
    pauVar41 = (undefined1 (*) [32])((long)pred * 2 + lVar39 * 2);
    iVar36 = mbd->bd;
    if (uVar20 == 0x20) {
      pauVar24 = (undefined1 (*) [32])(local_3320 + lVar39 * 2);
      pauVar33 = (undefined1 (*) [32])((long)puVar4 * 2 + lVar32 * 2 + 0x20);
      for (lVar32 = 0; uVar19 * 0x90 != (int)lVar32; lVar32 = lVar32 + 0x90) {
        auVar67 = vpsubw_avx2(pauVar33[-1],pauVar24[-1]);
        auVar65 = vpmullw_avx2(auVar67,auVar67);
        auVar67 = vpmulhw_avx2(auVar67,auVar67);
        auVar5 = vpunpcklwd_avx2(auVar65,auVar67);
        auVar67 = vpunpckhwd_avx2(auVar65,auVar67);
        auVar63._0_16_ = ZEXT116(0) * auVar67._0_16_ + ZEXT116(1) * auVar5._0_16_;
        auVar63._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar67._0_16_;
        auVar67 = vperm2i128_avx2(auVar5,auVar67,0x31);
        *(undefined1 (*) [32])(auStack_3258 + lVar32) = auVar63;
        *(undefined1 (*) [32])(auStack_3238 + lVar32) = auVar67;
        auVar67 = vpsubw_avx2(*pauVar33,*pauVar24);
        auVar65 = vpmullw_avx2(auVar67,auVar67);
        auVar67 = vpmulhw_avx2(auVar67,auVar67);
        auVar5 = vpunpcklwd_avx2(auVar65,auVar67);
        auVar67 = vpunpckhwd_avx2(auVar65,auVar67);
        auVar64._0_16_ = ZEXT116(0) * auVar67._0_16_ + ZEXT116(1) * auVar5._0_16_;
        auVar64._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar67._0_16_;
        auVar67 = vperm2i128_avx2(auVar5,auVar67,0x31);
        *(undefined1 (*) [32])(auStack_3218 + lVar32) = auVar64;
        *(undefined1 (*) [32])(auStack_31f8 + lVar32) = auVar67;
        pauVar24 = pauVar24 + 2;
        pauVar33 = (undefined1 (*) [32])(*pauVar33 + (ulong)uVar30 * 2);
      }
    }
    else {
      pauVar24 = (undefined1 (*) [32])(lVar32 * 2 + (long)puVar4 * 2);
      pauVar33 = pauVar41;
      for (lVar32 = 0; uVar19 * 0x90 != (int)lVar32; lVar32 = lVar32 + 0x90) {
        auVar67 = vpsubw_avx2(*pauVar24,*pauVar33);
        auVar65 = vpmullw_avx2(auVar67,auVar67);
        auVar67 = vpmulhw_avx2(auVar67,auVar67);
        auVar5 = vpunpcklwd_avx2(auVar65,auVar67);
        auVar67 = vpunpckhwd_avx2(auVar65,auVar67);
        auVar65._0_16_ = ZEXT116(0) * auVar67._0_16_ + ZEXT116(1) * auVar5._0_16_;
        auVar65._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar67._0_16_;
        auVar67 = vperm2i128_avx2(auVar5,auVar67,0x31);
        *(undefined1 (*) [32])(auStack_3258 + lVar32) = auVar65;
        *(undefined1 (*) [32])(auStack_3238 + lVar32) = auVar67;
        pauVar33 = (undefined1 (*) [32])(*pauVar33 + uVar20 * 2);
        pauVar24 = (undefined1 (*) [32])(*pauVar24 + (ulong)uVar30 * 2);
      }
    }
    auVar43 = ZEXT816(0);
    auVar68 = ZEXT1664(ZEXT816(0x401c000000000000));
    dVar49 = (dVar49 + 0.5) * local_3410 * (double)local_32d0._0_8_;
    pauVar24 = (undefined1 (*) [32])local_3260;
    lVar32 = 0x40;
    for (lVar25 = lVar32; lVar25 != 0xa0; lVar25 = lVar25 + 0x20) {
      auVar52 = vpermilps_avx(*(undefined1 (*) [16])*pauVar24,0xea);
      auVar67 = vblendpd_avx(ZEXT1632(auVar52),*pauVar24,0xc);
      *(undefined1 (*) [32])(local_33e0 + lVar25) = auVar67;
      pauVar24 = (undefined1 (*) [32])(pauVar24[4] + 0x10);
    }
    local_33e0._8_8_ = local_33a0[1];
    local_33e0._0_8_ = local_33a0[0];
    local_33e0._16_8_ = local_33a0[2];
    local_33e0._24_8_ = local_33a0[3];
    local_33c0._8_8_ = local_33a0[1];
    local_33c0._0_8_ = local_33a0[0];
    local_33c0._16_8_ = local_33a0[2];
    local_33c0._24_8_ = local_33a0[3];
    uVar30 = uVar19 - 3;
    uVar28 = 0;
    if (0 < (int)uVar30) {
      uVar28 = (ulong)uVar30;
    }
    for (uVar34 = 0; auVar67 = SUB6432(ZEXT1664((undefined1  [16])0x0),0), uVar34 != uVar28;
        uVar34 = uVar34 + 1) {
      auVar65 = vpaddd_avx2(local_33c0,local_33e0);
      auVar5._8_8_ = local_33a0[1];
      auVar5._0_8_ = local_33a0[0];
      auVar5._16_8_ = local_33a0[2];
      auVar5._24_8_ = local_33a0[3];
      auVar65 = vpaddd_avx2(auVar65,auVar5);
      auVar65 = vpaddd_avx2(auVar65,local_3380);
      for (lVar25 = 0; lVar25 != 0x80; lVar25 = lVar25 + 0x20) {
        uVar8 = *(undefined8 *)(local_33c0 + lVar25 + 8);
        uVar9 = *(undefined8 *)(local_33c0 + lVar25 + 0x10);
        uVar10 = *(undefined8 *)(local_33c0 + lVar25 + 0x18);
        *(undefined8 *)(local_33e0 + lVar25) = *(undefined8 *)(local_33c0 + lVar25);
        *(undefined8 *)(local_33e0 + lVar25 + 8) = uVar8;
        *(undefined8 *)(local_33e0 + lVar25 + 0x10) = uVar9;
        *(undefined8 *)(local_33e0 + lVar25 + 0x18) = uVar10;
      }
      auVar65 = vpaddd_avx2(auVar65,local_3360);
      auVar52 = vpermilps_avx(*(undefined1 (*) [16])*pauVar24,0xea);
      local_3360 = vblendps_avx(ZEXT1632(auVar52),*pauVar24,0xf0);
      auVar52 = vpaddd_avx(auVar65._0_16_,ZEXT416(auVar65._16_4_));
      auVar44 = vpshufd_avx(auVar52,0xee);
      auVar52 = vpaddd_avx(auVar52,auVar44);
      auVar5 = vpblendd_avx2(auVar65,auVar67,0xc1);
      auVar44 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
      auVar66 = vpsrldq_avx(auVar44,8);
      auVar44 = vpaddd_avx(auVar44,auVar66);
      auVar44 = vphaddd_avx(auVar52,auVar44);
      auVar67 = vpblendd_avx2(auVar65,auVar67,0x83);
      auVar52 = vpaddd_avx(auVar67._0_16_,auVar67._16_16_);
      auVar66 = vpsrldq_avx(auVar52,8);
      auVar52 = vpaddd_avx(auVar52,auVar66);
      auVar66 = vphaddd_avx(auVar52,auVar52);
      pauVar24 = (undefined1 (*) [32])(pauVar24[4] + 0x10);
      auVar52 = vblendps_avx(auVar43,auVar65._0_16_,8);
      auVar52 = vpaddd_avx(auVar52,auVar65._16_16_);
      auVar61 = vpsrldq_avx(auVar52,8);
      auVar52 = vpaddd_avx(auVar52,auVar61);
      auVar52 = vphaddd_avx(auVar52,auVar52);
      auVar44 = vpshufd_avx(auVar44,0xe8);
      auVar44 = vpunpcklqdq_avx(auVar44,auVar66);
      auVar52._4_4_ = auVar52._0_4_;
      auVar52._8_4_ = auVar52._0_4_;
      auVar52._12_4_ = auVar52._0_4_;
      auVar52 = vpblendd_avx2(auVar44,auVar52,8);
      *(undefined1 (*) [16])(local_2060 + uVar34 * 0x80) = auVar52;
    }
    uVar40 = (ulong)(int)uVar30;
    for (uVar34 = uVar40; auVar65 = local_3360, uVar34 != uVar27; uVar34 = uVar34 + 1) {
      auVar5 = vpaddd_avx2(local_33c0,local_33e0);
      auVar11._8_8_ = local_33a0[1];
      auVar11._0_8_ = local_33a0[0];
      auVar11._16_8_ = local_33a0[2];
      auVar11._24_8_ = local_33a0[3];
      auVar5 = vpaddd_avx2(auVar5,auVar11);
      auVar5 = vpaddd_avx2(auVar5,local_3380);
      for (lVar25 = 0; lVar25 != 0x80; lVar25 = lVar25 + 0x20) {
        uVar8 = *(undefined8 *)(local_33c0 + lVar25 + 8);
        uVar9 = *(undefined8 *)(local_33c0 + lVar25 + 0x10);
        uVar10 = *(undefined8 *)(local_33c0 + lVar25 + 0x18);
        *(undefined8 *)(local_33e0 + lVar25) = *(undefined8 *)(local_33c0 + lVar25);
        *(undefined8 *)(local_33e0 + lVar25 + 8) = uVar8;
        *(undefined8 *)(local_33e0 + lVar25 + 0x10) = uVar9;
        *(undefined8 *)(local_33e0 + lVar25 + 0x18) = uVar10;
      }
      auVar65 = vpaddd_avx2(auVar5,auVar65);
      auVar52 = vpaddd_avx(auVar65._0_16_,ZEXT416(auVar65._16_4_));
      auVar44 = vpshufd_avx(auVar52,0xee);
      auVar52 = vpaddd_avx(auVar52,auVar44);
      auVar5 = vpblendd_avx2(auVar65,auVar67,0xc1);
      auVar44 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
      auVar66 = vpsrldq_avx(auVar44,8);
      auVar44 = vpaddd_avx(auVar44,auVar66);
      auVar44 = vphaddd_avx(auVar52,auVar44);
      auVar5 = vpblendd_avx2(auVar65,auVar67,0x83);
      auVar52 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
      auVar66 = vpsrldq_avx(auVar52,8);
      auVar52 = vpaddd_avx(auVar52,auVar66);
      auVar66 = vphaddd_avx(auVar52,auVar52);
      auVar52 = vblendps_avx(auVar43,auVar65._0_16_,8);
      auVar52 = vpaddd_avx(auVar52,auVar65._16_16_);
      auVar61 = vpsrldq_avx(auVar52,8);
      auVar52 = vpaddd_avx(auVar52,auVar61);
      auVar52 = vphaddd_avx(auVar52,auVar52);
      auVar44 = vpshufd_avx(auVar44,0xe8);
      auVar44 = vpunpcklqdq_avx(auVar44,auVar66);
      auVar53._0_4_ = auVar52._0_4_;
      auVar53._4_4_ = auVar53._0_4_;
      auVar53._8_4_ = auVar53._0_4_;
      auVar53._12_4_ = auVar53._0_4_;
      auVar52 = vpblendd_avx2(auVar44,auVar53,8);
      *(undefined1 (*) [16])(local_2060 + uVar34 * 0x80) = auVar52;
    }
    for (uVar34 = 4; (long)uVar34 < (long)(int)(uVar20 - 4); uVar34 = uVar34 + 4) {
      pauVar24 = (undefined1 (*) [32])(local_3260 + uVar34);
      for (lVar25 = lVar32; lVar25 != 0xa0; lVar25 = lVar25 + 0x20) {
        uVar8 = *(undefined8 *)(*pauVar24 + 8);
        uVar9 = *(undefined8 *)(*pauVar24 + 0x10);
        uVar10 = *(undefined8 *)(*pauVar24 + 0x18);
        *(undefined8 *)(local_33e0 + lVar25) = *(undefined8 *)*pauVar24;
        *(undefined8 *)(local_33e0 + lVar25 + 8) = uVar8;
        *(undefined8 *)(local_33e0 + lVar25 + 0x10) = uVar9;
        *(undefined8 *)(local_33e0 + lVar25 + 0x18) = uVar10;
        pauVar24 = (undefined1 (*) [32])(pauVar24[4] + 0x10);
      }
      local_33e0._8_8_ = local_33a0[1];
      local_33e0._0_8_ = local_33a0[0];
      local_33e0._16_8_ = local_33a0[2];
      local_33e0._24_8_ = local_33a0[3];
      local_33c0._8_8_ = local_33a0[1];
      local_33c0._0_8_ = local_33a0[0];
      local_33c0._16_8_ = local_33a0[2];
      local_33c0._24_8_ = local_33a0[3];
      for (uVar37 = 0; uVar35 = uVar40, uVar37 != uVar28; uVar37 = uVar37 + 1) {
        auVar65 = vpaddd_avx2(local_33c0,local_33e0);
        auVar12._8_8_ = local_33a0[1];
        auVar12._0_8_ = local_33a0[0];
        auVar12._16_8_ = local_33a0[2];
        auVar12._24_8_ = local_33a0[3];
        auVar65 = vpaddd_avx2(auVar65,auVar12);
        auVar65 = vpaddd_avx2(auVar65,local_3380);
        for (lVar25 = 0; lVar25 != 0x80; lVar25 = lVar25 + 0x20) {
          uVar8 = *(undefined8 *)(local_33c0 + lVar25 + 8);
          uVar9 = *(undefined8 *)(local_33c0 + lVar25 + 0x10);
          uVar10 = *(undefined8 *)(local_33c0 + lVar25 + 0x18);
          *(undefined8 *)(local_33e0 + lVar25) = *(undefined8 *)(local_33c0 + lVar25);
          *(undefined8 *)(local_33e0 + lVar25 + 8) = uVar8;
          *(undefined8 *)(local_33e0 + lVar25 + 0x10) = uVar9;
          *(undefined8 *)(local_33e0 + lVar25 + 0x18) = uVar10;
        }
        auVar65 = vpaddd_avx2(auVar65,local_3360);
        local_3360 = *pauVar24;
        pauVar24 = (undefined1 (*) [32])(pauVar24[4] + 0x10);
        auVar52 = vpaddd_avx(auVar65._0_16_,ZEXT416(auVar65._16_4_));
        auVar44 = vpshufd_avx(auVar52,0xee);
        auVar52 = vpaddd_avx(auVar52,auVar44);
        auVar5 = vpblendd_avx2(auVar65,auVar67,0xc1);
        auVar44 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
        auVar66 = vpsrldq_avx(auVar44,8);
        auVar44 = vpaddd_avx(auVar44,auVar66);
        auVar44 = vphaddd_avx(auVar52,auVar44);
        auVar5 = vpblendd_avx2(auVar65,auVar67,0x83);
        auVar52 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
        auVar66 = vpsrldq_avx(auVar52,8);
        auVar52 = vpaddd_avx(auVar52,auVar66);
        auVar66 = vphaddd_avx(auVar52,auVar52);
        auVar52 = vblendps_avx(auVar43,auVar65._0_16_,8);
        auVar52 = vpaddd_avx(auVar52,auVar65._16_16_);
        auVar61 = vpsrldq_avx(auVar52,8);
        auVar52 = vpaddd_avx(auVar52,auVar61);
        auVar52 = vphaddd_avx(auVar52,auVar52);
        auVar44 = vpshufd_avx(auVar44,0xe8);
        auVar44 = vpunpcklqdq_avx(auVar44,auVar66);
        auVar54._0_4_ = auVar52._0_4_;
        auVar54._4_4_ = auVar54._0_4_;
        auVar54._8_4_ = auVar54._0_4_;
        auVar54._12_4_ = auVar54._0_4_;
        auVar52 = vpblendd_avx2(auVar44,auVar54,8);
        *(undefined1 (*) [16])(local_2060 + uVar34 * 4 + uVar37 * 0x80) = auVar52;
      }
      for (; auVar65 = local_3360, uVar35 != uVar27; uVar35 = uVar35 + 1) {
        auVar5 = vpaddd_avx2(local_33c0,local_33e0);
        auVar13._8_8_ = local_33a0[1];
        auVar13._0_8_ = local_33a0[0];
        auVar13._16_8_ = local_33a0[2];
        auVar13._24_8_ = local_33a0[3];
        auVar5 = vpaddd_avx2(auVar5,auVar13);
        auVar5 = vpaddd_avx2(auVar5,local_3380);
        for (lVar25 = 0; lVar25 != 0x80; lVar25 = lVar25 + 0x20) {
          uVar8 = *(undefined8 *)(local_33c0 + lVar25 + 8);
          uVar9 = *(undefined8 *)(local_33c0 + lVar25 + 0x10);
          uVar10 = *(undefined8 *)(local_33c0 + lVar25 + 0x18);
          *(undefined8 *)(local_33e0 + lVar25) = *(undefined8 *)(local_33c0 + lVar25);
          *(undefined8 *)(local_33e0 + lVar25 + 8) = uVar8;
          *(undefined8 *)(local_33e0 + lVar25 + 0x10) = uVar9;
          *(undefined8 *)(local_33e0 + lVar25 + 0x18) = uVar10;
        }
        auVar65 = vpaddd_avx2(auVar5,auVar65);
        auVar52 = vpaddd_avx(auVar65._0_16_,ZEXT416(auVar65._16_4_));
        auVar44 = vpshufd_avx(auVar52,0xee);
        auVar52 = vpaddd_avx(auVar52,auVar44);
        auVar5 = vpblendd_avx2(auVar65,auVar67,0xc1);
        auVar44 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
        auVar66 = vpsrldq_avx(auVar44,8);
        auVar44 = vpaddd_avx(auVar44,auVar66);
        auVar44 = vphaddd_avx(auVar52,auVar44);
        auVar5 = vpblendd_avx2(auVar65,auVar67,0x83);
        auVar52 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
        auVar66 = vpsrldq_avx(auVar52,8);
        auVar52 = vpaddd_avx(auVar52,auVar66);
        auVar66 = vphaddd_avx(auVar52,auVar52);
        auVar52 = vblendps_avx(auVar43,auVar65._0_16_,8);
        auVar52 = vpaddd_avx(auVar52,auVar65._16_16_);
        auVar61 = vpsrldq_avx(auVar52,8);
        auVar52 = vpaddd_avx(auVar52,auVar61);
        auVar52 = vphaddd_avx(auVar52,auVar52);
        auVar44 = vpshufd_avx(auVar44,0xe8);
        auVar44 = vpunpcklqdq_avx(auVar44,auVar66);
        auVar55._0_4_ = auVar52._0_4_;
        auVar55._4_4_ = auVar55._0_4_;
        auVar55._8_4_ = auVar55._0_4_;
        auVar55._12_4_ = auVar55._0_4_;
        auVar52 = vpblendd_avx2(auVar44,auVar55,8);
        *(undefined1 (*) [16])(local_2060 + uVar34 * 4 + uVar35 * 0x80) = auVar52;
      }
    }
    uVar34 = uVar34 & 0xffffffff;
    pauVar24 = (undefined1 (*) [32])(local_3260 + uVar34);
    for (; lVar32 != 0xa0; lVar32 = lVar32 + 0x20) {
      auVar65 = *pauVar24;
      auVar5 = vshufps_avx(auVar65,auVar65,0x54);
      auVar59._0_16_ = auVar65._0_16_;
      auVar59._16_16_ = auVar5._16_16_;
      *(undefined1 (*) [32])(local_33e0 + lVar32) = auVar59;
      pauVar24 = (undefined1 (*) [32])(pauVar24[4] + 0x10);
    }
    local_33e0._8_8_ = local_33a0[1];
    local_33e0._0_8_ = local_33a0[0];
    local_33e0._16_8_ = local_33a0[2];
    local_33e0._24_8_ = local_33a0[3];
    local_33c0 = local_33e0;
    for (uVar37 = 0; uVar37 != uVar28; uVar37 = uVar37 + 1) {
      auVar65 = vpaddd_avx2(local_33c0,local_33e0);
      auVar14._8_8_ = local_33a0[1];
      auVar14._0_8_ = local_33a0[0];
      auVar14._16_8_ = local_33a0[2];
      auVar14._24_8_ = local_33a0[3];
      auVar65 = vpaddd_avx2(auVar65,auVar14);
      auVar65 = vpaddd_avx2(auVar65,local_3380);
      for (lVar32 = 0; lVar32 != 0x80; lVar32 = lVar32 + 0x20) {
        uVar8 = *(undefined8 *)(local_33c0 + lVar32 + 8);
        uVar9 = *(undefined8 *)(local_33c0 + lVar32 + 0x10);
        uVar10 = *(undefined8 *)(local_33c0 + lVar32 + 0x18);
        *(undefined8 *)(local_33e0 + lVar32) = *(undefined8 *)(local_33c0 + lVar32);
        *(undefined8 *)(local_33e0 + lVar32 + 8) = uVar8;
        *(undefined8 *)(local_33e0 + lVar32 + 0x10) = uVar9;
        *(undefined8 *)(local_33e0 + lVar32 + 0x18) = uVar10;
      }
      auVar63 = vpaddd_avx2(auVar65,local_3360);
      auVar65 = *pauVar24;
      auVar5 = vshufps_avx(auVar65,auVar65,0x54);
      local_3360._0_16_ = auVar65._0_16_;
      local_3360._16_16_ = auVar5._16_16_;
      pauVar24 = (undefined1 (*) [32])(pauVar24[4] + 0x10);
      auVar52 = vpaddd_avx(auVar63._0_16_,ZEXT416(auVar63._16_4_));
      auVar44 = vpshufd_avx(auVar52,0xee);
      auVar52 = vpaddd_avx(auVar52,auVar44);
      auVar65 = vpblendd_avx2(auVar63,auVar67,0xc1);
      auVar44 = vpaddd_avx(auVar65._0_16_,auVar65._16_16_);
      auVar66 = vpsrldq_avx(auVar44,8);
      auVar44 = vpaddd_avx(auVar44,auVar66);
      auVar44 = vphaddd_avx(auVar52,auVar44);
      auVar65 = vpblendd_avx2(auVar63,auVar67,0x83);
      auVar52 = vpaddd_avx(auVar65._0_16_,auVar65._16_16_);
      auVar66 = vpsrldq_avx(auVar52,8);
      auVar52 = vpaddd_avx(auVar52,auVar66);
      auVar66 = vphaddd_avx(auVar52,auVar52);
      auVar52 = vblendps_avx(auVar43,auVar63._0_16_,8);
      auVar52 = vpaddd_avx(auVar52,auVar63._16_16_);
      auVar61 = vpsrldq_avx(auVar52,8);
      auVar52 = vpaddd_avx(auVar52,auVar61);
      auVar52 = vphaddd_avx(auVar52,auVar52);
      auVar44 = vpshufd_avx(auVar44,0xe8);
      auVar44 = vpunpcklqdq_avx(auVar44,auVar66);
      auVar56._0_4_ = auVar52._0_4_;
      auVar56._4_4_ = auVar56._0_4_;
      auVar56._8_4_ = auVar56._0_4_;
      auVar56._12_4_ = auVar56._0_4_;
      auVar52 = vpblendd_avx2(auVar44,auVar56,8);
      *(undefined1 (*) [16])(local_2060 + uVar34 * 4 + uVar37 * 0x80) = auVar52;
    }
    for (; auVar65 = local_3360, uVar40 != uVar27; uVar40 = uVar40 + 1) {
      auVar5 = vpaddd_avx2(local_33c0,local_33e0);
      auVar15._8_8_ = local_33a0[1];
      auVar15._0_8_ = local_33a0[0];
      auVar15._16_8_ = local_33a0[2];
      auVar15._24_8_ = local_33a0[3];
      auVar5 = vpaddd_avx2(auVar5,auVar15);
      auVar5 = vpaddd_avx2(auVar5,local_3380);
      for (lVar32 = 0; lVar32 != 0x80; lVar32 = lVar32 + 0x20) {
        uVar8 = *(undefined8 *)(local_33c0 + lVar32 + 8);
        uVar9 = *(undefined8 *)(local_33c0 + lVar32 + 0x10);
        uVar10 = *(undefined8 *)(local_33c0 + lVar32 + 0x18);
        *(undefined8 *)(local_33e0 + lVar32) = *(undefined8 *)(local_33c0 + lVar32);
        *(undefined8 *)(local_33e0 + lVar32 + 8) = uVar8;
        *(undefined8 *)(local_33e0 + lVar32 + 0x10) = uVar9;
        *(undefined8 *)(local_33e0 + lVar32 + 0x18) = uVar10;
      }
      auVar65 = vpaddd_avx2(auVar5,auVar65);
      auVar52 = vpaddd_avx(auVar65._0_16_,ZEXT416(auVar65._16_4_));
      auVar44 = vpshufd_avx(auVar52,0xee);
      auVar52 = vpaddd_avx(auVar52,auVar44);
      auVar5 = vpblendd_avx2(auVar65,auVar67,0xc1);
      auVar44 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
      auVar66 = vpsrldq_avx(auVar44,8);
      auVar44 = vpaddd_avx(auVar44,auVar66);
      auVar44 = vphaddd_avx(auVar52,auVar44);
      auVar5 = vpblendd_avx2(auVar65,auVar67,0x83);
      auVar52 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
      auVar66 = vpsrldq_avx(auVar52,8);
      auVar52 = vpaddd_avx(auVar52,auVar66);
      auVar66 = vphaddd_avx(auVar52,auVar52);
      auVar52 = vblendps_avx(auVar43,auVar65._0_16_,8);
      auVar52 = vpaddd_avx(auVar52,auVar65._16_16_);
      auVar61 = vpsrldq_avx(auVar52,8);
      auVar52 = vpaddd_avx(auVar52,auVar61);
      auVar52 = vphaddd_avx(auVar52,auVar52);
      auVar44 = vpshufd_avx(auVar44,0xe8);
      auVar44 = vpunpcklqdq_avx(auVar44,auVar66);
      auVar57._0_4_ = auVar52._0_4_;
      auVar57._4_4_ = auVar57._0_4_;
      auVar57._8_4_ = auVar57._0_4_;
      auVar57._12_4_ = auVar57._0_4_;
      auVar52 = vpblendd_avx2(auVar44,auVar57,8);
      *(undefined1 (*) [16])(local_2060 + uVar34 * 4 + uVar40 * 0x80) = auVar52;
    }
    for (lVar32 = 0; lVar32 != 4; lVar32 = lVar32 + 1) {
      adStack_3280[lVar32] = (double)subblock_mses[lVar32] * 0.008333333333333333;
      local_32c0[lVar32 + 4] = (1.0 / dVar49) * local_32c0[lVar32];
    }
    uVar28 = (ulong)(bVar16 >> 1);
    uVar34 = (ulong)(bVar17 >> 1);
    bVar22 = (char)iVar36 * '\x02' - 0x10;
    if (tf_wgt_calc_lvl == 0) {
      local_32f0 = (ulong)(uVar20 * 2);
      local_32f8 = count + lVar39;
      local_33e8 = local_2060;
      local_33f0 = local_1060;
      lVar32 = 0;
      uVar40 = 0;
      while (puVar18 = local_32f8, uVar40 != uVar27) {
        local_32e0 = uVar40;
        lVar32 = (long)(int)lVar32;
        local_32d8 = accum + lVar39 + lVar32;
        local_32e8 = lVar32;
        for (uVar27 = 0; uVar21 != uVar27; uVar27 = uVar27 + 1) {
          uVar37 = (ulong)(((uint)(uVar34 <= uVar27) | (uint)(uVar28 <= uVar40) * 2) << 3);
          dVar49 = (dVar48 * (double)((uint)(local_33f0[uVar27] + *(int *)(local_33e8 + uVar27 * 4))
                                     >> (bVar22 & 0x1f)) * 0.041666666666666664 +
                   *(double *)((long)adStack_3280 + uVar37)) *
                   *(double *)((long)local_32c0 + uVar37 + 0x20);
          uVar3 = *(ushort *)(*pauVar41 + uVar27 * 2);
          auVar58._0_8_ = -dVar49;
          auVar58._8_8_ = 0x8000000000000000;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar49;
          auVar43 = vcmpsd_avx(auVar47,auVar68._0_16_,1);
          auVar62._8_8_ = 0xc01c000000000000;
          auVar62._0_8_ = 0xc01c000000000000;
          auVar43 = vblendvpd_avx(auVar62,auVar58,auVar43);
          dVar49 = exp(auVar43._0_8_);
          auVar68 = ZEXT1664(ZEXT816(0x401c000000000000));
          puVar18[lVar32 + uVar27] = puVar18[lVar32 + uVar27] + (short)(int)(dVar49 * 1000.0);
          local_32d8[uVar27] = local_32d8[uVar27] + (uint)uVar3 * (int)(dVar49 * 1000.0);
        }
        local_33f0 = local_33f0 + 0x20;
        local_33e8 = local_33e8 + 0x80;
        pauVar41 = (undefined1 (*) [32])(*pauVar41 + local_32f0);
        lVar32 = local_32e8 + uVar27;
        uVar27 = local_3330._0_8_;
        uVar40 = local_32e0 + 1;
      }
    }
    else {
      puVar29 = local_2060;
      piVar31 = local_1060;
      lVar32 = 0;
      for (uVar40 = 0; uVar40 != uVar27; uVar40 = uVar40 + 1) {
        lVar32 = (long)(int)lVar32;
        for (uVar37 = 0; uVar21 != uVar37; uVar37 = uVar37 + 1) {
          uVar3 = *(ushort *)(*pauVar41 + uVar37 * 2);
          uVar35 = (ulong)(((uint)(uVar34 <= uVar37) | (uint)(uVar28 <= uVar40) * 2) << 3);
          auVar46._8_8_ = 0;
          auVar46._0_8_ =
               (dVar48 * (double)((uint)(piVar31[uVar37] + *(int *)(puVar29 + uVar37 * 4)) >>
                                 (bVar22 & 0x1f)) * 0.041666666666666664 +
               *(double *)((long)adStack_3280 + uVar35)) *
               *(double *)((long)local_32c0 + uVar35 + 0x20);
          auVar43 = vminsd_avx(auVar46,ZEXT816(0x401c000000000000));
          iVar36 = (int)((float)((int)((float)auVar43._0_8_ * -12102203.0) + 0x3f7f127f) * 1000.0 +
                        0.5);
          count[lVar39 + lVar32 + uVar37] = count[lVar39 + lVar32 + uVar37] + (short)iVar36;
          accum[lVar39 + lVar32 + uVar37] = accum[lVar39 + lVar32 + uVar37] + (uint)uVar3 * iVar36;
        }
        piVar31 = piVar31 + 0x20;
        puVar29 = puVar29 + 0x80;
        pauVar41 = (undefined1 (*) [32])(*pauVar41 + uVar20 * 2);
        lVar32 = lVar32 + uVar37;
      }
    }
    local_3454 = local_3454 + uVar20 * uVar19;
    uVar28 = local_3300 + 1;
  }
  return;
}

Assistant:

void av1_highbd_apply_temporal_filter_avx2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint32_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };
  uint16_t *pred1 = CONVERT_TO_SHORTPTR(pred);

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint16_t *ref =
        CONVERT_TO_SHORTPTR(frame_to_filter->buffers[plane]) + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    highbd_apply_temporal_filter(
        ref, frame_stride, pred1 + plane_offset, plane_w, plane_w, plane_h,
        subblock_mses, accum + plane_offset, count + plane_offset, frame_sse,
        luma_sse_sum, mbd->bd, inv_num_ref_pixels, decay_factor, inv_factor,
        weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}